

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressBlock_splitBlock
                 (ZSTD_CCtx *zc,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 lastBlock)

{
  uint uVar1;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  size_t bss;
  size_t cSize;
  U32 nbSeq;
  BYTE *op;
  BYTE *ip;
  U32 lastBlock_local;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *zc_local;
  
  zc_local = (ZSTD_CCtx *)ZSTD_buildSeqStore(zc,src,srcSize);
  uVar1 = ERR_isError((size_t)zc_local);
  if (uVar1 == 0) {
    if (zc_local == (ZSTD_CCtx *)0x1) {
      if ((((zc->blockState).prevCBlock)->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
        (((zc->blockState).prevCBlock)->entropy).fse.offcode_repeatMode = FSE_repeat_check;
      }
      zc_local = (ZSTD_CCtx *)ZSTD_noCompressBlock(dst,dstCapacity,src,srcSize,lastBlock);
      ERR_isError((size_t)zc_local);
    }
    else {
      zc_local = (ZSTD_CCtx *)
                 ZSTD_compressBlock_splitBlock_internal
                           (zc,dst,dstCapacity,src,srcSize,lastBlock,
                            (U32)((long)(zc->seqStore).sequences -
                                  (long)(zc->seqStore).sequencesStart >> 3));
      ERR_isError((size_t)zc_local);
    }
  }
  return (size_t)zc_local;
}

Assistant:

static size_t ZSTD_compressBlock_splitBlock(ZSTD_CCtx* zc,
                                        void* dst, size_t dstCapacity,
                                        const void* src, size_t srcSize, U32 lastBlock) {
    const BYTE* ip = (const BYTE*)src;
    BYTE* op = (BYTE*)dst;
    U32 nbSeq;
    size_t cSize;
    DEBUGLOG(4, "ZSTD_compressBlock_splitBlock");

    {   const size_t bss = ZSTD_buildSeqStore(zc, src, srcSize);
        FORWARD_IF_ERROR(bss, "ZSTD_buildSeqStore failed");
        if (bss == ZSTDbss_noCompress) {
            if (zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode == FSE_repeat_valid)
                zc->blockState.prevCBlock->entropy.fse.offcode_repeatMode = FSE_repeat_check;
            cSize = ZSTD_noCompressBlock(op, dstCapacity, ip, srcSize, lastBlock);
            FORWARD_IF_ERROR(cSize, "ZSTD_noCompressBlock failed");
            DEBUGLOG(4, "ZSTD_compressBlock_splitBlock: Nocompress block");
            return cSize;
        }
        nbSeq = (U32)(zc->seqStore.sequences - zc->seqStore.sequencesStart);
    }

    assert(zc->appliedParams.splitBlocks == 1);
    cSize = ZSTD_compressBlock_splitBlock_internal(zc, dst, dstCapacity, src, srcSize, lastBlock, nbSeq);
    FORWARD_IF_ERROR(cSize, "Splitting blocks failed!");
    return cSize;
}